

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O2

SC_WireLoad * Abc_SclFetchWireLoadModel(SC_Lib *p,char *pWLoadUsed)

{
  int iVar1;
  SC_WireLoad *pSVar2;
  int i;
  int level;
  SC_Lib *__s1;
  
  if (pWLoadUsed == (char *)0x0) {
    __assert_fail("pWLoadUsed != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/map/scl/sclLibUtil.c"
                  ,0x170,"SC_WireLoad *Abc_SclFetchWireLoadModel(SC_Lib *, char *)");
  }
  pSVar2 = (SC_WireLoad *)0x0;
  i = 0;
  __s1 = p;
  do {
    level = (int)__s1;
    iVar1 = (p->vWireLoads).nSize;
    if (iVar1 <= i) {
LAB_003bd114:
      if (iVar1 != i) {
        return pSVar2;
      }
      Abc_Print(level,"Cannot find wire load model \"%s\".\n",pWLoadUsed);
      exit(1);
    }
    pSVar2 = (SC_WireLoad *)Vec_PtrEntry(&p->vWireLoads,i);
    __s1 = (SC_Lib *)pSVar2->pName;
    iVar1 = strcmp((char *)__s1,pWLoadUsed);
    level = (int)__s1;
    if (iVar1 == 0) {
      iVar1 = (p->vWireLoads).nSize;
      goto LAB_003bd114;
    }
    i = i + 1;
  } while( true );
}

Assistant:

SC_WireLoad * Abc_SclFetchWireLoadModel( SC_Lib * p, char * pWLoadUsed )
{
    SC_WireLoad * pWL = NULL;
    int i;
    // Get the actual table and reformat it for 'wire_cap' output:
    assert( pWLoadUsed != NULL );
    SC_LibForEachWireLoad( p, pWL, i )
        if ( !strcmp(pWL->pName, pWLoadUsed) )
            break;
    if ( i == Vec_PtrSize(&p->vWireLoads) )
    {
        Abc_Print( -1, "Cannot find wire load model \"%s\".\n", pWLoadUsed );
        exit(1);
    }
//    printf( "Using wireload model \"%s\".\n", pWL->pName );
    return pWL;
}